

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::clipToEffectiveMask(QWidgetPrivate *this,QRegion *region)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 uVar6;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar7;
  long in_FS_OFFSET;
  QRegion QStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  local_40 = 0;
  lVar7 = lVar2;
  if ((this->graphicsEffect != (QGraphicsEffect *)0x0) &&
     ((*(byte *)(*(long *)(lVar2 + 0x20) + 0xc) & 1) == 0)) {
    lVar7 = *(long *)(*(long *)(lVar2 + 8) + 0x10);
    uVar1 = (this->data).crect.x1;
    uVar6 = (this->data).crect.y1;
    local_40 = CONCAT44(-uVar6,-uVar1);
  }
  for (; lVar7 != 0; lVar7 = *(long *)(*(long *)(lVar7 + 8) + 0x10)) {
    lVar3 = *(long *)(lVar7 + 8);
    lVar4 = *(long *)(lVar3 + 0x78);
    if ((lVar4 != 0) && ((*(byte *)(lVar4 + 0x7c) & 0x80) != 0)) {
      if (lVar7 == lVar2) {
        QRegion::QRegion(&QStack_48,(QRegion *)(lVar4 + 0x40));
      }
      else {
        QRegion::translated(&QStack_48,(QPoint *)(lVar4 + 0x40));
      }
      QRegion::operator&=(region,&QStack_48);
      QRegion::~QRegion(&QStack_48);
    }
    if ((*(byte *)(*(long *)(lVar7 + 0x20) + 0xc) & 1) != 0) break;
    uVar5 = *(undefined8 *)(lVar3 + 0x1c4);
    local_40 = CONCAT44(local_40._4_4_ - (int)((ulong)uVar5 >> 0x20),(int)local_40 - (int)uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::clipToEffectiveMask(QRegion &region) const
{
    Q_Q(const QWidget);

    const QWidget *w = q;
    QPoint offset;

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && !w->isWindow()) {
        w = q->parentWidget();
        offset -= data.crect.topLeft();
    }
#endif // QT_CONFIG(graphicseffect)

    while (w) {
        const QWidgetPrivate *wd = w->d_func();
        if (wd->extra && wd->extra->hasMask)
            region &= (w != q) ? wd->extra->mask.translated(offset) : wd->extra->mask;
        if (w->isWindow())
            return;
        offset -= wd->data.crect.topLeft();
        w = w->parentWidget();
    }
}